

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkInputOutputCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Addition;
  int Addition_00;
  Vec_Int_t *extraout_RDX;
  Vec_Int_t *pVVar3;
  Vec_Int_t *extraout_RDX_00;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  pVVar3 = vFon;
  for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,iVar4);
    iVar6 = (pAVar2->vFanouts).nSize;
    if (iVar5 <= iVar6) {
      iVar5 = iVar6;
    }
    pVVar3 = extraout_RDX;
  }
  iVar4 = 0;
  for (iVar6 = 0; iVar6 < pNtk->vCos->nSize; iVar6 = iVar6 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,iVar6);
    iVar1 = *(int *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray] + 0x1c);
    if (iVar4 <= iVar1) {
      iVar4 = iVar1;
    }
    pVVar3 = extraout_RDX_00;
  }
  Vec_IntFill(vFan,iVar4 + 1,(int)pVVar3);
  Vec_IntFill(vFon,iVar5 + 1,Fill);
  Vec_IntFill(vFanR,iVar4 + 1,Fill_00);
  Vec_IntFill(vFonR,iVar5 + 1,Fill_01);
  for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,iVar5);
    iVar4 = (pAVar2->vFanouts).nSize;
    Vec_IntAddToEntry(vFon,iVar4,Addition);
    Vec_IntWriteEntry(vFonR,iVar4,pAVar2->Id);
  }
  for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,iVar5);
    iVar4 = *(int *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray] + 0x1c);
    Vec_IntAddToEntry(vFan,iVar4,Addition_00);
    Vec_IntWriteEntry(vFanR,iVar4,pAVar2->Id);
  }
  return;
}

Assistant:

void Abc_NtkInputOutputCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    int i, nFanins, nFanouts;
    int nFaninsMax = 0, nFanoutsMax = 0;
    Abc_NtkForEachCi( pNtk, pNode, i )
        nFanoutsMax = Abc_MaxInt( nFanoutsMax, Abc_ObjFanoutNum(pNode) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        nFaninsMax  = Abc_MaxInt( nFaninsMax,  Abc_ObjFaninNum(Abc_ObjFanin0(pNode)) );
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        nFanouts = Abc_ObjFanoutNum( pNode );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFonR, nFanouts, Abc_ObjId(pNode) );
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        nFanins  = Abc_ObjFaninNum( Abc_ObjFanin0(pNode) );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, Abc_ObjId(pNode) );
    }
}